

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O1

optional<pbrt::BSDFSample> * __thiscall
pbrt::DielectricInterfaceBxDF::Sample_f
          (optional<pbrt::BSDFSample> *__return_storage_ptr__,DielectricInterfaceBxDF *this,
          Vector3f wo,Float uc,Point2f u,TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  TrowbridgeReitzDistribution *this_00;
  ulong uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  bool bVar9;
  int iVar10;
  undefined8 uVar11;
  long in_FS_OFFSET;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Float FVar17;
  anon_struct_4_0_00000001_for___align aVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float cd;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  Vector3f VVar60;
  Vector3f wo_00;
  Vector3f wm;
  Vector3f wm_00;
  Vector3f local_140;
  Vector3f local_130;
  float local_120;
  float local_11c;
  Tuple3<pbrt::Vector3,_float> local_118;
  undefined1 local_108 [24];
  float local_f0;
  float local_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  float local_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 auVar28 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 auVar42 [64];
  
  auVar41._4_60_ = wo._12_60_;
  auVar41._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar27._8_56_ = wo._8_56_;
  auVar27._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_108._0_4_ = uc;
  local_130.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar27._0_16_);
  auVar14 = vminss_avx(ZEXT416((uint)(this->mfDistrib).alpha_y),
                       ZEXT416((uint)(this->mfDistrib).alpha_x));
  local_130.super_Tuple3<pbrt::Vector3,_float>.z = auVar41._0_4_;
  if (0.001 <= auVar14._0_4_) {
    this_00 = &this->mfDistrib;
    VVar60 = TrowbridgeReitzDistribution::Sample_wm(this_00,wo,u);
    auVar42._0_4_ = VVar60.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar42._4_60_ = auVar41._4_60_;
    auVar28._0_8_ = VVar60.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar28._8_56_ = auVar27._8_56_;
    auVar16 = auVar28._0_16_;
    local_140.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar16);
    auVar14 = vmovshdup_avx(auVar16);
    fVar19 = auVar14._0_4_;
    auVar14 = vfmadd231ss_fma(ZEXT416((uint)(local_130.super_Tuple3<pbrt::Vector3,_float>.y * fVar19
                                            )),
                              ZEXT416((uint)local_130.super_Tuple3<pbrt::Vector3,_float>.x),auVar16)
    ;
    auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)local_130.super_Tuple3<pbrt::Vector3,_float>.z),
                              auVar42._0_16_);
    fVar12 = auVar14._0_4_ + auVar14._0_4_;
    auVar43._0_12_ = ZEXT812(0);
    auVar43._12_4_ = 0;
    auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar19 * 0.0)),auVar16,auVar43);
    fVar33 = auVar42._0_4_ + auVar14._0_4_;
    if (fVar33 < 0.0) {
      auVar16._0_8_ = auVar28._0_8_ ^ 0x8000000080000000;
      auVar16._8_4_ = auVar27._8_4_ ^ 0x80000000;
      auVar16._12_4_ = auVar27._12_4_ ^ 0x80000000;
    }
    uVar11 = vcmpss_avx512f(ZEXT416((uint)fVar33),auVar43,1);
    bVar2 = (bool)((byte)uVar11 & 1);
    auVar15._4_12_ = auVar41._4_12_;
    auVar15._0_4_ = (uint)bVar2 * (int)-auVar42._0_4_ + (uint)!bVar2 * (int)auVar42._0_4_;
    auVar14 = vmovshdup_avx(auVar16);
    auVar14 = vfmadd213ss_fma(ZEXT416((uint)(VVar60.super_Tuple3<pbrt::Vector3,_float>.x * fVar12 -
                                            local_130.super_Tuple3<pbrt::Vector3,_float>.x)),auVar16
                              ,ZEXT416((uint)((fVar19 * fVar12 -
                                              local_130.super_Tuple3<pbrt::Vector3,_float>.y) *
                                             auVar14._0_4_)));
    auVar16 = vfmadd231ss_fma(auVar14,ZEXT416((uint)(auVar42._0_4_ * fVar12 -
                                                    local_130.super_Tuple3<pbrt::Vector3,_float>.z))
                              ,auVar15);
    bVar8 = auVar16._0_4_ < -1.0;
    auVar15 = SUB6416(ZEXT464(0x3f800000),0);
    auVar14 = vminss_avx(auVar15,auVar16);
    fVar12 = (float)((uint)bVar8 * -0x40800000 + (uint)!bVar8 * auVar14._0_4_);
    bVar9 = 0.0 < fVar12;
    auVar14._8_4_ = 0x7fffffff;
    auVar14._0_8_ = 0x7fffffff7fffffff;
    auVar14._12_4_ = 0x7fffffff;
    auVar14 = vandps_avx512vl(auVar16,auVar14);
    uVar11 = vcmpss_avx512f(auVar15,auVar16,1);
    bVar2 = (bool)((byte)uVar11 & 1);
    local_d8._4_12_ = auVar14._4_12_;
    auVar16 = ZEXT416((uint)bVar9 * (int)this->eta + (uint)!bVar9 * (int)(1.0 / this->eta));
    local_d8._0_4_ =
         (uint)bVar9 * (int)fVar12 +
         (uint)!bVar9 *
         ((uint)bVar8 * 0x3f800000 +
         (uint)!bVar8 * ((uint)bVar2 * 0x3f800000 + (uint)!bVar2 * auVar14._0_4_));
    auVar14 = vfnmadd213ss_fma(local_d8,local_d8,auVar15);
    auVar14 = vmaxss_avx(auVar14,auVar43);
    local_140.super_Tuple3<pbrt::Vector3,_float>.z = auVar42._0_4_;
    if (auVar14._0_4_ < 0.0) {
      local_e8 = auVar16;
      auVar30._0_4_ = sqrtf(auVar14._0_4_);
      auVar30._4_60_ = extraout_var_00;
      auVar14 = auVar30._0_16_;
      auVar16 = local_e8;
    }
    else {
      auVar14 = vsqrtss_avx(auVar14,auVar14);
    }
    auVar20._0_4_ = auVar14._0_4_ / auVar16._0_4_;
    auVar20._4_12_ = auVar14._4_12_;
    auVar14 = SUB6416(ZEXT464(0x3f800000),0);
    if (auVar20._0_4_ < 1.0) {
      auVar14 = vfnmadd213ss_fma(auVar20,auVar20,ZEXT416(0x3f800000));
      auVar14 = vmaxss_avx(auVar14,ZEXT816(0) << 0x40);
      if (auVar14._0_4_ < 0.0) {
        local_e8 = auVar16;
        auVar32._0_4_ = sqrtf(auVar14._0_4_);
        auVar32._4_60_ = extraout_var_02;
        auVar14 = auVar32._0_16_;
        auVar16 = local_e8;
      }
      else {
        auVar14 = vsqrtss_avx(auVar14,auVar14);
      }
      auVar15 = vfmsub213ss_fma(local_d8,auVar16,auVar14);
      auVar43 = vfmadd213ss_fma(local_d8,auVar16,auVar14);
      auVar36._0_4_ = auVar15._0_4_ / auVar43._0_4_;
      auVar36._4_12_ = auVar15._4_12_;
      auVar43 = vfnmadd213ss_fma(auVar14,auVar16,local_d8);
      auVar14 = vfmadd213ss_fma(auVar14,auVar16,local_d8);
      fVar12 = auVar43._0_4_ / auVar14._0_4_;
      auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * fVar12)),auVar36,auVar36);
      auVar14 = ZEXT416((uint)(auVar14._0_4_ * 0.5));
    }
    fVar12 = 1.0 - auVar14._0_4_;
    fVar33 = (float)((uint)((byte)sampleFlags & 1) * (int)auVar14._0_4_);
    auVar16 = ZEXT416((uint)fVar12);
    fVar12 = (float)((uint)((sampleFlags & Transmission) != Unset) * (int)fVar12);
    local_58 = ZEXT416((uint)fVar12);
    if ((((fVar33 == 0.0) && (!NAN(fVar33))) && (fVar12 == 0.0)) && (!NAN(fVar12))) {
LAB_00314a98:
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
      *(undefined8 *)&__return_storage_ptr__->optionalValue = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
      return __return_storage_ptr__;
    }
    local_e8._0_4_ = fVar33 + fVar12;
    if (fVar33 / (fVar33 + fVar12) <= (float)local_108._0_4_) {
      auVar15 = ZEXT816(0);
      uVar11 = vcmpss_avx512f(auVar15,ZEXT416((uint)local_130.super_Tuple3<pbrt::Vector3,_float>.z),
                              1);
      bVar2 = (bool)((byte)uVar11 & 1);
      fVar12 = (float)((uint)bVar2 * (int)this->eta + (uint)!bVar2 * (int)(1.0 / this->eta));
      local_d8 = ZEXT416((uint)fVar12);
      local_118.x = 0.0;
      local_118.y = 0.0;
      local_118.z = 0.0;
      auVar58._8_8_ = 0;
      auVar58._0_4_ = local_130.super_Tuple3<pbrt::Vector3,_float>.x;
      auVar58._4_4_ = local_130.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar14 = vmovshdup_avx(auVar58);
      auVar59._8_8_ = 0;
      auVar59._0_4_ = local_140.super_Tuple3<pbrt::Vector3,_float>.x;
      auVar59._4_4_ = local_140.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar43 = vmovshdup_avx(auVar59);
      auVar14 = vfmadd213ss_fma(auVar43,auVar14,
                                ZEXT416((uint)(local_140.super_Tuple3<pbrt::Vector3,_float>.z *
                                              local_130.super_Tuple3<pbrt::Vector3,_float>.z)));
      auVar43 = vfmsub231ss_fma(ZEXT416((uint)(local_140.super_Tuple3<pbrt::Vector3,_float>.z *
                                              local_130.super_Tuple3<pbrt::Vector3,_float>.z)),
                                ZEXT416((uint)local_140.super_Tuple3<pbrt::Vector3,_float>.z),
                                ZEXT416((uint)local_130.super_Tuple3<pbrt::Vector3,_float>.z));
      auVar43 = vfmadd231ss_fma(ZEXT416((uint)(auVar14._0_4_ + auVar43._0_4_)),auVar59,auVar58);
      auVar14 = vfnmadd213ss_fma(auVar43,auVar43,SUB6416(ZEXT464(0x3f800000),0));
      auVar14 = vmaxss_avx(auVar14,auVar15);
      fVar12 = auVar14._0_4_ / (fVar12 * fVar12);
      local_108._0_4_ = fVar12;
      local_c8 = auVar16;
      if (fVar12 < 1.0) {
        auVar14 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar12)),auVar15);
        if (auVar14._0_4_ < 0.0) {
          local_120 = local_130.super_Tuple3<pbrt::Vector3,_float>.z;
          local_78._0_4_ = local_140.super_Tuple3<pbrt::Vector3,_float>.z;
          local_88._0_4_ = auVar43._0_4_;
          local_b8 = auVar58;
          local_68 = auVar59;
          fVar19 = sqrtf(auVar14._0_4_);
          auVar43 = ZEXT416((uint)local_88._0_4_);
          fVar33 = (float)local_78._0_4_;
          auVar59 = local_68;
          auVar58 = local_b8;
          fVar12 = local_120;
        }
        else {
          auVar14 = vsqrtss_avx(auVar14,auVar14);
          fVar19 = auVar14._0_4_;
          fVar33 = local_140.super_Tuple3<pbrt::Vector3,_float>.z;
          fVar12 = local_130.super_Tuple3<pbrt::Vector3,_float>.z;
        }
        fVar13 = local_d8._0_4_;
        fVar19 = auVar43._0_4_ / fVar13 - fVar19;
        auVar46._4_4_ = fVar13;
        auVar46._0_4_ = fVar13;
        auVar46._8_4_ = fVar13;
        auVar46._12_4_ = fVar13;
        auVar14 = vdivps_avx(auVar58,auVar46);
        auVar22._0_4_ = auVar59._0_4_ * fVar19;
        auVar22._4_4_ = auVar59._4_4_ * fVar19;
        auVar22._8_4_ = auVar59._8_4_ * fVar19;
        auVar22._12_4_ = auVar59._12_4_ * fVar19;
        auVar14 = vsubps_avx(auVar22,auVar14);
        local_118.z = fVar33 * fVar19 - fVar12 / fVar13;
        local_118._0_8_ = vmovlps_avx(auVar14);
      }
      if ((Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
           ::reg == '\0') &&
         (iVar10 = __cxa_guard_acquire(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                        ::reg), iVar10 != 0)) {
        StatRegisterer::StatRegisterer
                  ((StatRegisterer *)
                   &Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                    ::reg,Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                          ::StatsAccumulator__,(PixelAccumFunc)0x0);
        __cxa_guard_release(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                             ::reg);
      }
      *(long *)(in_FS_OFFSET + -0x508) = *(long *)(in_FS_OFFSET + -0x508) + 1;
      if (1.0 <= (float)local_108._0_4_) {
        *(long *)(in_FS_OFFSET + -0x510) = *(long *)(in_FS_OFFSET + -0x510) + 1;
      }
      if ((local_130.super_Tuple3<pbrt::Vector3,_float>.z * local_118.z <= 0.0) &&
         ((float)local_108._0_4_ < 1.0)) {
        auVar14 = ZEXT816(0) << 0x40;
        if ((local_118.z != 0.0) || (NAN(local_118.z))) {
          local_b8._0_4_ = local_130.super_Tuple3<pbrt::Vector3,_float>.z;
          local_120 = local_118.z;
          auVar38._8_8_ = 0;
          auVar38._0_4_ = local_140.super_Tuple3<pbrt::Vector3,_float>.x;
          auVar38._4_4_ = local_140.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar16 = vmovshdup_avx(auVar38);
          auVar16 = vfmadd213ss_fma(auVar16,auVar14,
                                    ZEXT416((uint)local_140.super_Tuple3<pbrt::Vector3,_float>.z));
          auVar16 = vfmadd231ss_fma(ZEXT416((uint)(auVar16._0_4_ +
                                                  (local_140.super_Tuple3<pbrt::Vector3,_float>.z -
                                                  local_140.super_Tuple3<pbrt::Vector3,_float>.z))),
                                    auVar38,auVar14);
          if (auVar16._0_4_ < 0.0) {
            auVar38._0_8_ = local_140.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
            auVar38._8_4_ = 0x80000000;
            auVar38._12_4_ = 0x80000000;
          }
          uVar11 = vcmpss_avx512f(auVar16,auVar14,1);
          bVar2 = (bool)((byte)uVar11 & 1);
          local_140.super_Tuple3<pbrt::Vector3,_float>.z =
               (float)((uint)bVar2 * (int)-local_140.super_Tuple3<pbrt::Vector3,_float>.z +
                      (uint)!bVar2 * (int)local_140.super_Tuple3<pbrt::Vector3,_float>.z);
          local_68 = ZEXT416((uint)local_140.super_Tuple3<pbrt::Vector3,_float>.z);
          uVar1 = vmovlps_avx(auVar38);
          local_140.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar1;
          local_140.super_Tuple3<pbrt::Vector3,_float>.y = (float)(uVar1 >> 0x20);
          auVar16 = vfmadd231ss_fma(ZEXT416((uint)(local_140.super_Tuple3<pbrt::Vector3,_float>.y *
                                                  local_130.super_Tuple3<pbrt::Vector3,_float>.y)),
                                    ZEXT416((uint)local_140.super_Tuple3<pbrt::Vector3,_float>.x),
                                    ZEXT416((uint)local_130.super_Tuple3<pbrt::Vector3,_float>.x));
          local_78._0_4_ = auVar16._0_4_;
          auVar16 = vfmadd231ss_fma(ZEXT416((uint)(local_140.super_Tuple3<pbrt::Vector3,_float>.y *
                                                  local_118.y)),
                                    ZEXT416((uint)local_140.super_Tuple3<pbrt::Vector3,_float>.x),
                                    ZEXT416((uint)local_118.x));
          local_88._0_4_ = auVar16._0_4_;
          fVar12 = local_140.super_Tuple3<pbrt::Vector3,_float>.z *
                   local_140.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar14 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar12)),auVar14);
          fVar19 = auVar14._0_4_;
          local_140.super_Tuple3<pbrt::Vector3,_float>._0_8_ = uVar1;
          fVar33 = 0.0;
          if ((ABS(fVar19 / fVar12) != INFINITY) &&
             (local_11c = fVar12 * fVar12, 1e-16 <= local_11c)) {
            auVar56._8_8_ = 0;
            auVar56._0_8_ = uVar1;
            local_108._0_4_ = fVar19 / fVar12;
            if (fVar19 < 0.0) {
              local_98 = auVar56;
              fVar12 = sqrtf(fVar19);
              auVar56 = local_98;
            }
            else {
              auVar14 = vsqrtss_avx(auVar14,auVar14);
              fVar12 = auVar14._0_4_;
            }
            fVar33 = 1.0;
            if ((fVar12 != 0.0) || (NAN(fVar12))) {
              auVar25._0_4_ = auVar56._0_4_ / fVar12;
              auVar25._4_12_ = auVar56._4_12_;
              auVar14 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar25);
              uVar11 = vcmpss_avx512f(auVar25,SUB6416(ZEXT464(0xbf800000),0),1);
              bVar2 = (bool)((byte)uVar11 & 1);
              fVar33 = (float)((uint)bVar2 * -0x40800000 + (uint)!bVar2 * auVar14._0_4_);
            }
            fVar12 = this_00->alpha_x * this_00->alpha_x;
            auVar48._8_8_ = 0;
            auVar48._0_4_ = local_140.super_Tuple3<pbrt::Vector3,_float>.x;
            auVar48._4_4_ = local_140.super_Tuple3<pbrt::Vector3,_float>.y;
            auVar14 = vmaxss_avx(ZEXT416((uint)(1.0 - local_140.super_Tuple3<pbrt::Vector3,_float>.z
                                                      * local_140.super_Tuple3<pbrt::Vector3,_float>
                                                        .z)),ZEXT816(0));
            if (auVar14._0_4_ < 0.0) {
              local_f0 = fVar12;
              local_ec = fVar33 * fVar33;
              local_98 = auVar48;
              fVar19 = sqrtf(auVar14._0_4_);
              fVar12 = local_f0;
              fVar33 = local_ec;
              auVar48 = local_98;
            }
            else {
              auVar14 = vsqrtss_avx(auVar14,auVar14);
              fVar19 = auVar14._0_4_;
              fVar33 = fVar33 * fVar33;
            }
            fVar13 = 0.0;
            if ((fVar19 != 0.0) || (NAN(fVar19))) {
              auVar14 = vmovshdup_avx(auVar48);
              auVar26._0_4_ = auVar14._0_4_ / fVar19;
              auVar26._4_12_ = auVar14._4_12_;
              auVar14 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar26);
              uVar11 = vcmpss_avx512f(auVar26,SUB6416(ZEXT464(0xbf800000),0),1);
              bVar2 = (bool)((byte)uVar11 & 1);
              fVar13 = (float)((uint)bVar2 * -0x40800000 + (uint)!bVar2 * auVar14._0_4_);
            }
            fVar19 = (this->mfDistrib).alpha_y;
            fVar12 = (fVar33 / fVar12 + (fVar13 * fVar13) / (fVar19 * fVar19)) *
                     (float)local_108._0_4_ + 1.0;
            fVar33 = 1.0 / (fVar19 * (this->mfDistrib).alpha_x * 3.1415927 * local_11c *
                           fVar12 * fVar12);
          }
          local_11c = fVar33;
          FVar17 = TrowbridgeReitzDistribution::Lambda(this_00,&local_130);
          local_98._0_4_ = FVar17;
          local_f0 = TrowbridgeReitzDistribution::Lambda(this_00,(Vector3f *)&local_118);
          auVar14 = vfmadd231ss_fma(ZEXT416((uint)(local_140.super_Tuple3<pbrt::Vector3,_float>.y *
                                                  local_118.y)),
                                    ZEXT416((uint)local_140.super_Tuple3<pbrt::Vector3,_float>.x),
                                    ZEXT416((uint)local_118.x));
          local_ec = local_118.z;
          auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)local_118.z),
                                    ZEXT416((uint)local_140.super_Tuple3<pbrt::Vector3,_float>.z));
          auVar7._8_4_ = 0x7fffffff;
          auVar7._0_8_ = 0x7fffffff7fffffff;
          auVar7._12_4_ = 0x7fffffff;
          local_48 = vandps_avx512vl(auVar14,auVar7);
          auVar16 = vfmadd231ss_fma(ZEXT416((uint)(local_140.super_Tuple3<pbrt::Vector3,_float>.y *
                                                  local_130.super_Tuple3<pbrt::Vector3,_float>.y)),
                                    ZEXT416((uint)local_140.super_Tuple3<pbrt::Vector3,_float>.x),
                                    ZEXT416((uint)local_130.super_Tuple3<pbrt::Vector3,_float>.x));
          local_38 = vfmadd231ss_fma(auVar16,ZEXT416((uint)local_130.
                                                           super_Tuple3<pbrt::Vector3,_float>.z),
                                     ZEXT416((uint)local_140.super_Tuple3<pbrt::Vector3,_float>.z));
          auVar14 = vfmadd132ss_fma(auVar14,local_38,ZEXT416((uint)local_d8._0_4_));
          local_108._0_4_ = local_48._0_4_ / (auVar14._0_4_ * auVar14._0_4_);
          local_9c = local_130.super_Tuple3<pbrt::Vector3,_float>.z;
          VVar60.super_Tuple3<pbrt::Vector3,_float>.z =
               local_130.super_Tuple3<pbrt::Vector3,_float>.z;
          VVar60.super_Tuple3<pbrt::Vector3,_float>.x =
               local_130.super_Tuple3<pbrt::Vector3,_float>.x;
          VVar60.super_Tuple3<pbrt::Vector3,_float>.y =
               local_130.super_Tuple3<pbrt::Vector3,_float>.y;
          wm_00.super_Tuple3<pbrt::Vector3,_float>.z =
               local_140.super_Tuple3<pbrt::Vector3,_float>.z;
          wm_00.super_Tuple3<pbrt::Vector3,_float>.x =
               local_140.super_Tuple3<pbrt::Vector3,_float>.x;
          wm_00.super_Tuple3<pbrt::Vector3,_float>.y =
               local_140.super_Tuple3<pbrt::Vector3,_float>.y;
          FVar17 = TrowbridgeReitzDistribution::PDF(this_00,VVar60,wm_00);
          fVar12 = (FVar17 * (float)local_108._0_4_ * (float)local_58._0_4_) / (float)local_e8._0_4_
          ;
          if (NAN(fVar12)) {
            LogFatal<char_const(&)[12]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bxdfs.cpp"
                       ,0xe3,"Check failed: %s",(char (*) [12])"!IsNaN(pdf)");
          }
          fVar33 = 1.0 / local_d8._0_4_;
          auVar14 = vfmadd213ss_fma(ZEXT416((uint)local_b8._0_4_),local_68,
                                    ZEXT416((uint)local_78._0_4_));
          auVar16 = vfmadd213ss_fma(ZEXT416((uint)local_120),local_68,ZEXT416((uint)local_88._0_4_))
          ;
          auVar43 = vfmadd213ss_fma(auVar16,local_d8,auVar14);
          auVar54._8_4_ = 0x7fffffff;
          auVar54._0_8_ = 0x7fffffff7fffffff;
          auVar54._12_4_ = 0x7fffffff;
          auVar14 = vandps_avx(auVar54,local_38);
          auVar16 = vandps_avx(ZEXT416((uint)(local_9c * local_ec)),auVar54);
          auVar49._0_4_ =
               ((1.0 / ((float)local_98._0_4_ + 1.0 + local_f0)) * local_11c * (float)local_48._0_4_
               * auVar14._0_4_) / (auVar43._0_4_ * auVar43._0_4_ * auVar16._0_4_);
          auVar49._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar14 = vandps_avx(auVar49,auVar54);
          aVar18 = (anon_struct_4_0_00000001_for___align)
                   ((float)((uint)(mode == Radiance) * (int)(fVar33 * fVar33) +
                           (uint)(mode != Radiance) * 0x3f800000) * (float)local_c8._0_4_ *
                   auVar14._0_4_);
          __return_storage_ptr__->set = true;
          (__return_storage_ptr__->optionalValue).__align = aVar18;
          *(anon_struct_4_0_00000001_for___align *)
           ((long)&__return_storage_ptr__->optionalValue + 4) = aVar18;
          *(anon_struct_4_0_00000001_for___align *)
           ((long)&__return_storage_ptr__->optionalValue + 8) = aVar18;
          *(anon_struct_4_0_00000001_for___align *)
           ((long)&__return_storage_ptr__->optionalValue + 0xc) = aVar18;
          *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = local_118._0_8_;
          *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = local_118.z;
          *(float *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = fVar12;
          *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 10;
          *(float *)((long)&__return_storage_ptr__->optionalValue + 0x24) = local_d8._0_4_;
          goto LAB_003154b8;
        }
      }
      goto LAB_00314a98;
    }
    auVar45._8_8_ = 0;
    auVar45._0_4_ = local_130.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar45._4_4_ = local_130.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar52._8_8_ = 0;
    auVar52._0_4_ = local_140.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar52._4_4_ = local_140.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar55._0_4_ =
         local_130.super_Tuple3<pbrt::Vector3,_float>.x *
         local_140.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar55._4_4_ =
         local_130.super_Tuple3<pbrt::Vector3,_float>.y *
         local_140.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar55._8_8_ = 0;
    auVar16 = vmovshdup_avx(auVar55);
    auVar16 = vfmadd231ss_fma(auVar16,auVar45,auVar52);
    auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)local_130.super_Tuple3<pbrt::Vector3,_float>.z),
                              ZEXT416((uint)local_140.super_Tuple3<pbrt::Vector3,_float>.z));
    fVar12 = auVar16._0_4_ + auVar16._0_4_;
    auVar53._0_4_ = local_140.super_Tuple3<pbrt::Vector3,_float>.x * fVar12;
    auVar53._4_4_ = local_140.super_Tuple3<pbrt::Vector3,_float>.y * fVar12;
    auVar53._8_4_ = fVar12 * 0.0;
    auVar53._12_4_ = fVar12 * 0.0;
    auVar16 = vsubps_avx(auVar53,auVar45);
    local_118.z = local_140.super_Tuple3<pbrt::Vector3,_float>.z * fVar12 -
                  local_130.super_Tuple3<pbrt::Vector3,_float>.z;
    local_118._0_8_ = vmovlps_avx(auVar16);
    local_d8 = auVar14;
    local_108._0_4_ = fVar33;
    local_108._4_12_ = auVar14._4_12_;
    if ((Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
         ::reg == '\0') &&
       (iVar10 = __cxa_guard_acquire(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                      ::reg), iVar10 != 0)) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)
                 &Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                  ::reg,Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                        ::StatsAccumulator__,(PixelAccumFunc)0x0);
      __cxa_guard_release(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                           ::reg);
    }
    *(long *)(in_FS_OFFSET + -0x518) = *(long *)(in_FS_OFFSET + -0x518) + 1;
    auVar14 = vfmadd231ss_fma(ZEXT416((uint)(local_130.super_Tuple3<pbrt::Vector3,_float>.y *
                                            local_140.super_Tuple3<pbrt::Vector3,_float>.y)),
                              ZEXT416((uint)local_130.super_Tuple3<pbrt::Vector3,_float>.x),
                              ZEXT416((uint)local_140.super_Tuple3<pbrt::Vector3,_float>.x));
    auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)local_130.super_Tuple3<pbrt::Vector3,_float>.z),
                              ZEXT416((uint)local_140.super_Tuple3<pbrt::Vector3,_float>.z));
    if (auVar14._0_4_ <= 0.0) {
      *(long *)(in_FS_OFFSET + -0x520) = *(long *)(in_FS_OFFSET + -0x520) + 1;
      goto LAB_00314a98;
    }
    if (local_130.super_Tuple3<pbrt::Vector3,_float>.z * local_118.z <= 0.0) goto LAB_00314a98;
    wo_00.super_Tuple3<pbrt::Vector3,_float>.z = local_130.super_Tuple3<pbrt::Vector3,_float>.z;
    wo_00.super_Tuple3<pbrt::Vector3,_float>.x = local_130.super_Tuple3<pbrt::Vector3,_float>.x;
    wo_00.super_Tuple3<pbrt::Vector3,_float>.y = local_130.super_Tuple3<pbrt::Vector3,_float>.y;
    wm.super_Tuple3<pbrt::Vector3,_float>.z = local_140.super_Tuple3<pbrt::Vector3,_float>.z;
    wm.super_Tuple3<pbrt::Vector3,_float>.x = local_140.super_Tuple3<pbrt::Vector3,_float>.x;
    wm.super_Tuple3<pbrt::Vector3,_float>.y = local_140.super_Tuple3<pbrt::Vector3,_float>.y;
    FVar17 = TrowbridgeReitzDistribution::PDF(this_00,wo_00,wm);
    auVar14 = vfmadd231ss_fma(ZEXT416((uint)(local_130.super_Tuple3<pbrt::Vector3,_float>.y *
                                            local_140.super_Tuple3<pbrt::Vector3,_float>.y)),
                              ZEXT416((uint)local_130.super_Tuple3<pbrt::Vector3,_float>.x),
                              ZEXT416((uint)local_140.super_Tuple3<pbrt::Vector3,_float>.x));
    local_58 = ZEXT416((uint)local_130.super_Tuple3<pbrt::Vector3,_float>.z);
    auVar14 = vfmadd231ss_fma(auVar14,local_58,
                              ZEXT416((uint)local_140.super_Tuple3<pbrt::Vector3,_float>.z));
    fVar12 = ((FVar17 / (auVar14._0_4_ * 4.0)) * (float)local_108._0_4_) / (float)local_e8._0_4_;
    if (NAN(fVar12)) {
      LogFatal<char_const(&)[12]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bxdfs.cpp"
                 ,0xbf,"Check failed: %s",(char (*) [12])"!IsNaN(pdf)");
    }
    if (((local_130.super_Tuple3<pbrt::Vector3,_float>.z == 0.0) &&
        (!NAN(local_130.super_Tuple3<pbrt::Vector3,_float>.z))) ||
       ((local_118.z == 0.0 && (!NAN(local_118.z))))) goto LAB_00314a98;
    local_108._0_4_ = fVar12;
    local_e8 = ZEXT416((uint)local_118.z);
    local_c8._0_4_ = TrowbridgeReitzDistribution::D(this_00,&local_140);
    FVar17 = TrowbridgeReitzDistribution::G(this_00,&local_130,(Vector3f *)&local_118);
    auVar37._8_4_ = 0x7fffffff;
    auVar37._0_8_ = 0x7fffffff7fffffff;
    auVar37._12_4_ = 0x7fffffff;
    auVar14 = vandps_avx(auVar37,local_58);
    auVar16 = vandps_avx(auVar37,local_e8);
    aVar18 = (anon_struct_4_0_00000001_for___align)
             ((FVar17 * (float)local_c8._0_4_ * (float)local_d8._0_4_) /
             (auVar14._0_4_ * auVar16._0_4_ * 4.0));
    __return_storage_ptr__->set = true;
    (__return_storage_ptr__->optionalValue).__align = aVar18;
    *(anon_struct_4_0_00000001_for___align *)((long)&__return_storage_ptr__->optionalValue + 4) =
         aVar18;
    *(anon_struct_4_0_00000001_for___align *)((long)&__return_storage_ptr__->optionalValue + 8) =
         aVar18;
    *(anon_struct_4_0_00000001_for___align *)((long)&__return_storage_ptr__->optionalValue + 0xc) =
         aVar18;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = local_118._0_8_;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = local_118.z;
    *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = local_108._0_4_;
    uVar11 = 0x3f80000000000009;
  }
  else {
    bVar8 = auVar41._0_4_ < -1.0;
    auVar16 = auVar41._0_16_;
    auVar43 = SUB6416(ZEXT464(0x3f800000),0);
    auVar14 = vminss_avx(auVar43,auVar16);
    fVar12 = (float)((uint)bVar8 * -0x40800000 + (uint)!bVar8 * auVar14._0_4_);
    bVar9 = 0.0 < fVar12;
    auVar3._8_4_ = 0x7fffffff;
    auVar3._0_8_ = 0x7fffffff7fffffff;
    auVar3._12_4_ = 0x7fffffff;
    auVar14 = vandps_avx512vl(auVar16,auVar3);
    uVar11 = vcmpss_avx512f(auVar43,auVar16,1);
    bVar2 = (bool)((byte)uVar11 & 1);
    local_d8._4_12_ = auVar14._4_12_;
    local_e8 = ZEXT416((uint)bVar9 * (int)this->eta + (uint)!bVar9 * (int)(1.0 / this->eta));
    local_d8._0_4_ =
         (uint)bVar9 * (int)fVar12 +
         (uint)!bVar9 *
         ((uint)bVar8 * 0x3f800000 +
         (uint)!bVar8 * ((uint)bVar2 * 0x3f800000 + (uint)!bVar2 * auVar14._0_4_));
    auVar14 = vfnmadd213ss_fma(local_d8,local_d8,auVar43);
    auVar14 = vmaxss_avx(auVar14,ZEXT816(0));
    if (auVar14._0_4_ < 0.0) {
      auVar29._0_4_ = sqrtf(auVar14._0_4_);
      auVar29._4_60_ = extraout_var;
      auVar14 = auVar29._0_16_;
    }
    else {
      auVar14 = vsqrtss_avx(auVar14,auVar14);
    }
    auVar34._0_4_ = auVar14._0_4_ / local_e8._0_4_;
    auVar34._4_12_ = auVar14._4_12_;
    fVar12 = 1.0;
    if (auVar34._0_4_ < 1.0) {
      auVar14 = vfnmadd213ss_fma(auVar34,auVar34,ZEXT416(0x3f800000));
      auVar14 = vmaxss_avx(auVar14,ZEXT816(0) << 0x40);
      if (auVar14._0_4_ < 0.0) {
        auVar31._0_4_ = sqrtf(auVar14._0_4_);
        auVar31._4_60_ = extraout_var_01;
        auVar14 = auVar31._0_16_;
      }
      else {
        auVar14 = vsqrtss_avx(auVar14,auVar14);
      }
      auVar43 = vfmsub213ss_fma(local_d8,local_e8,auVar14);
      auVar16 = vfmadd213ss_fma(local_d8,local_e8,auVar14);
      auVar35._0_4_ = auVar43._0_4_ / auVar16._0_4_;
      auVar35._4_12_ = auVar43._4_12_;
      auVar16 = vfnmadd213ss_fma(auVar14,local_e8,local_d8);
      auVar14 = vfmadd213ss_fma(auVar14,local_e8,local_d8);
      fVar12 = auVar16._0_4_ / auVar14._0_4_;
      auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * fVar12)),auVar35,auVar35);
      fVar12 = auVar14._0_4_ * 0.5;
    }
    fVar33 = (float)((uint)((byte)sampleFlags & 1) * (int)fVar12);
    local_e8 = ZEXT416((uint)(1.0 - fVar12));
    fVar19 = (float)((uint)((sampleFlags & Transmission) != Unset) * (int)(1.0 - fVar12));
    local_d8 = ZEXT416((uint)fVar19);
    if (((fVar33 == 0.0) && (fVar19 == 0.0)) && (!NAN(fVar19))) goto LAB_00314a98;
    local_58._0_4_ = fVar33 + fVar19;
    fVar33 = fVar33 / (fVar33 + fVar19);
    if (fVar33 <= (float)local_108._0_4_) {
      auVar43 = ZEXT816(0);
      uVar11 = vcmpss_avx512f(auVar43,ZEXT416((uint)local_130.super_Tuple3<pbrt::Vector3,_float>.z),
                              1);
      bVar2 = (bool)((byte)uVar11 & 1);
      fVar12 = (float)((uint)bVar2 * (int)this->eta + (uint)!bVar2 * (int)(1.0 / this->eta));
      local_108._0_16_ = ZEXT416((uint)fVar12);
      local_b8._8_8_ = 0;
      local_b8._0_4_ = local_130.super_Tuple3<pbrt::Vector3,_float>.x;
      local_b8._4_4_ = local_130.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar14 = vmovshdup_avx(local_b8);
      auVar16 = vfmadd132ss_fma(ZEXT416((uint)local_130.super_Tuple3<pbrt::Vector3,_float>.y),
                                ZEXT416((uint)local_130.super_Tuple3<pbrt::Vector3,_float>.z),
                                auVar43);
      auVar16 = vfmadd231ss_fma(ZEXT416((uint)((local_130.super_Tuple3<pbrt::Vector3,_float>.z -
                                               local_130.super_Tuple3<pbrt::Vector3,_float>.z) +
                                              auVar16._0_4_)),auVar43,
                                ZEXT416((uint)local_130.super_Tuple3<pbrt::Vector3,_float>.x));
      auVar51._0_12_ = ZEXT812(0);
      auVar51._12_4_ = 0;
      if (auVar16._0_4_ < 0.0) {
        auVar57._8_4_ = 0x80000000;
        auVar57._0_8_ = 0x8000000080000000;
        auVar57._12_4_ = 0x80000000;
      }
      else {
        auVar57 = ZEXT816(0) << 0x40;
      }
      auVar15 = vmovshdup_avx(auVar57);
      uVar11 = vcmpss_avx512f(auVar16,auVar43,1);
      bVar2 = (bool)((byte)uVar11 & 1);
      fVar33 = (float)((uint)bVar2 * -0x40800000 + (uint)!bVar2 * 0x3f800000);
      auVar14 = vfmadd213ss_fma(auVar14,auVar15,
                                ZEXT416((uint)(fVar33 * local_130.super_Tuple3<pbrt::Vector3,_float>
                                                        .z)));
      auVar16 = vfmsub231ss_fma(ZEXT416((uint)(fVar33 * local_130.super_Tuple3<pbrt::Vector3,_float>
                                                        .z)),ZEXT416((uint)fVar33),
                                ZEXT416((uint)local_130.super_Tuple3<pbrt::Vector3,_float>.z));
      auVar16 = vfmadd231ss_fma(ZEXT416((uint)(auVar14._0_4_ + auVar16._0_4_)),auVar57,local_b8);
      auVar14 = vfnmadd213ss_fma(auVar16,auVar16,SUB6416(ZEXT464(0x3f800000),0));
      local_c8 = ZEXT816(0) << 0x20;
      auVar14 = vmaxss_avx(auVar14,auVar43);
      local_68 = ZEXT416((uint)(fVar12 * fVar12));
      local_120 = auVar14._0_4_ / (fVar12 * fVar12);
      if (local_120 < 1.0) {
        auVar14 = vmaxss_avx(ZEXT416((uint)(1.0 - local_120)),ZEXT816(0) << 0x20);
        if (auVar14._0_4_ < 0.0) {
          local_c8._4_12_ = SUB1612(ZEXT816(0),0);
          local_c8._0_4_ = local_130.super_Tuple3<pbrt::Vector3,_float>.z;
          local_11c = auVar16._0_4_;
          local_88 = ZEXT416((uint)fVar33);
          local_78 = auVar57;
          fVar12 = sqrtf(auVar14._0_4_);
          auVar16 = ZEXT416((uint)local_11c);
          fVar33 = (float)local_88._0_4_;
          auVar57 = local_78;
        }
        else {
          auVar14 = vsqrtss_avx(auVar14,auVar14);
          fVar12 = auVar14._0_4_;
          local_c8._0_4_ = local_130.super_Tuple3<pbrt::Vector3,_float>.z;
        }
        fVar19 = local_108._0_4_;
        fVar12 = auVar16._0_4_ / fVar19 - fVar12;
        auVar47._4_4_ = fVar19;
        auVar47._0_4_ = fVar19;
        auVar47._8_4_ = fVar19;
        auVar47._12_4_ = fVar19;
        auVar14 = vdivps_avx(local_b8,auVar47);
        auVar23._0_4_ = auVar57._0_4_ * fVar12;
        auVar23._4_4_ = auVar57._4_4_ * fVar12;
        auVar23._8_4_ = auVar57._8_4_ * fVar12;
        auVar23._12_4_ = auVar57._12_4_ * fVar12;
        auVar51 = vsubps_avx(auVar23,auVar14);
        local_c8 = ZEXT416((uint)(fVar33 * fVar12 - (float)local_c8._0_4_ / fVar19));
      }
      local_b8 = auVar51;
      if ((Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
           ::reg == '\0') &&
         (iVar10 = __cxa_guard_acquire(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                        ::reg), iVar10 != 0)) {
        StatRegisterer::StatRegisterer
                  ((StatRegisterer *)
                   &Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                    ::reg,Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                          ::StatsAccumulator__,(PixelAccumFunc)0x0);
        __cxa_guard_release(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                             ::reg);
      }
      *(long *)(in_FS_OFFSET + -0x528) = *(long *)(in_FS_OFFSET + -0x528) + 1;
      if (1.0 <= local_120) {
        *(long *)(in_FS_OFFSET + -0x530) = *(long *)(in_FS_OFFSET + -0x530) + 1;
        goto LAB_00314a98;
      }
      auVar24._0_4_ = (float)local_e8._0_4_ * (this->tint).values.values[0];
      auVar24._4_4_ = (float)local_e8._0_4_ * (this->tint).values.values[1];
      auVar24._8_4_ = (float)local_e8._0_4_ * (this->tint).values.values[2];
      auVar24._12_4_ = (float)local_e8._0_4_ * (this->tint).values.values[3];
      auVar39._4_4_ = local_c8._0_4_;
      auVar39._0_4_ = local_c8._0_4_;
      auVar39._8_4_ = local_c8._0_4_;
      auVar39._12_4_ = local_c8._0_4_;
      auVar6._8_4_ = 0x7fffffff;
      auVar6._0_8_ = 0x7fffffff7fffffff;
      auVar6._12_4_ = 0x7fffffff;
      auVar14 = vandps_avx512vl(auVar39,auVar6);
      auVar14 = vdivps_avx(auVar24,auVar14);
      if (mode == Radiance) {
        auVar40._4_4_ = local_68._0_4_;
        auVar40._0_4_ = local_68._0_4_;
        auVar40._8_4_ = local_68._0_4_;
        auVar40._12_4_ = local_68._0_4_;
        auVar14 = vdivps_avx(auVar14,auVar40);
      }
      __return_storage_ptr__->set = true;
      *(undefined1 (*) [16])&__return_storage_ptr__->optionalValue = auVar14;
      uVar11 = vmovlps_avx(local_b8);
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar11;
      *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = local_c8._0_4_;
      *(float *)((long)&__return_storage_ptr__->optionalValue + 0x1c) =
           (float)local_d8._0_4_ / (float)local_58._0_4_;
      *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0x12;
      *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x24) = local_108._0_4_;
      goto LAB_003154b8;
    }
    auVar21._0_4_ = fVar12 * (this->tint).values.values[0];
    auVar21._4_4_ = fVar12 * (this->tint).values.values[1];
    auVar21._8_4_ = fVar12 * (this->tint).values.values[2];
    auVar21._12_4_ = fVar12 * (this->tint).values.values[3];
    auVar44._4_4_ = local_130.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar44._0_4_ = local_130.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar44._8_4_ = local_130.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar44._12_4_ = local_130.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar50._8_8_ = 0;
    auVar50._0_4_ = local_130.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar50._4_4_ = local_130.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar4._8_4_ = 0x80000000;
    auVar4._0_8_ = 0x8000000080000000;
    auVar4._12_4_ = 0x80000000;
    auVar16 = vxorps_avx512vl(auVar50,auVar4);
    auVar5._8_4_ = 0x7fffffff;
    auVar5._0_8_ = 0x7fffffff7fffffff;
    auVar5._12_4_ = 0x7fffffff;
    auVar14 = vandps_avx512vl(auVar44,auVar5);
    auVar14 = vdivps_avx(auVar21,auVar14);
    __return_storage_ptr__->set = true;
    *(undefined1 (*) [16])&__return_storage_ptr__->optionalValue = auVar14;
    uVar11 = vmovlps_avx(auVar16);
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar11;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
         local_130.super_Tuple3<pbrt::Vector3,_float>.z;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = fVar33;
    uVar11 = 0x3f80000000000011;
  }
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = uVar11;
LAB_003154b8:
  (__return_storage_ptr__->optionalValue).__data[0x28] = '\0';
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<BSDFSample> DielectricInterfaceBxDF::Sample_f(
    Vector3f wo, Float uc, Point2f u, TransportMode mode,
    BxDFReflTransFlags sampleFlags) const {
    if (mfDistrib.EffectivelySmooth()) {
        // Sample delta dielectric interface
        Float R = FrDielectric(CosTheta(wo), eta), T = 1 - R;
        // Compute probabilities _pr_ and _pt_ for sampling reflection and transmission
        Float pr = R, pt = T;
        if (!(sampleFlags & BxDFReflTransFlags::Reflection))
            pr = 0;
        if (!(sampleFlags & BxDFReflTransFlags::Transmission))
            pt = 0;
        if (pr == 0 && pt == 0)
            return {};

        if (uc < pr / (pr + pt)) {
            // Sample perfect specular reflection at interface
            Vector3f wi(-wo.x, -wo.y, wo.z);
            SampledSpectrum fr(tint * R / AbsCosTheta(wi));
            return BSDFSample(fr, wi, pr / (pr + pt), BxDFFlags::SpecularReflection);

        } else {
            // Sample perfect specular transmission at interface
            // Figure out which $\eta$ is incident and which is transmitted
            bool entering = CosTheta(wo) > 0;
            Float etap = entering ? eta : (1 / eta);

            // Compute ray direction for specular transmission
            Vector3f wi;
            bool tir = !Refract(wo, FaceForward(Normal3f(0, 0, 1), wo), etap, &wi);
            CHECK_RARE(1e-5f, tir);
            if (tir)
                return {};

            SampledSpectrum ft(tint * T / AbsCosTheta(wi));
            // Account for non-symmetry with transmission to different medium
            if (mode == TransportMode::Radiance)
                ft /= Sqr(etap);

            return BSDFSample(ft, wi, pt / (pr + pt), BxDFFlags::SpecularTransmission,
                              etap);
        }

    } else {
        // Sample non-delta dielectric interface
        // Sample half-angle vector for outgoing direction and compute Frensel factor
        Vector3f wh = mfDistrib.Sample_wm(wo, u);
        Float F =
            FrDielectric(Dot(Reflect(wo, wh), FaceForward(wh, Vector3f(0, 0, 1))), eta);
        Float R = F, T = 1 - R;

        // Compute probabilities _pr_ and _pt_ for sampling reflection and transmission
        Float pr = R, pt = T;
        if (!(sampleFlags & BxDFReflTransFlags::Reflection))
            pr = 0;
        if (!(sampleFlags & BxDFReflTransFlags::Transmission))
            pt = 0;
        if (pr == 0 && pt == 0)
            return {};

        if (uc < pr / (pr + pt)) {
            // Sample reflection at non-delta dielectric interface
            Vector3f wi = Reflect(wo, wh);
            CHECK_RARE(1e-5f, Dot(wo, wh) <= 0);
            if (!SameHemisphere(wo, wi) || Dot(wo, wh) <= 0)
                return {};
            // Compute PDF of direction $\wi$ for microfacet reflection
            Float pdf = mfDistrib.PDF(wo, wh) / (4 * Dot(wo, wh)) * pr / (pr + pt);
            CHECK(!IsNaN(pdf));

            // Evaluate BRDF and return _BSDFSample_ for dielectric microfacet reflection
            Float cosTheta_o = AbsCosTheta(wo), cosTheta_i = AbsCosTheta(wi);
            if (cosTheta_i == 0 || cosTheta_o == 0)
                return {};
            SampledSpectrum f(mfDistrib.D(wh) * mfDistrib.G(wo, wi) * F /
                              (4 * cosTheta_i * cosTheta_o));
            return BSDFSample(f, wi, pdf, BxDFFlags::GlossyReflection);

        } else {
            // Sample transmission at non-delta dielectric interface
            Float etap = CosTheta(wo) > 0 ? eta : (1 / eta);
            Vector3f wi;
            bool tir = !Refract(wo, (Normal3f)wh, etap, &wi);
            CHECK_RARE(1e-5f, tir);
            if (SameHemisphere(wo, wi))
                return {};
            if (tir || wi.z == 0)
                return {};

            // Evaluate BSDF
            wh = FaceForward(wh, Normal3f(0, 0, 1));

            Float sqrtDenom = Dot(wo, wh) + etap * Dot(wi, wh);
            Float factor = (mode == TransportMode::Radiance) ? Sqr(1 / etap) : 1;

            SampledSpectrum f(
                (1 - F) * factor *
                std::abs(mfDistrib.D(wh) * mfDistrib.G(wo, wi) * AbsDot(wi, wh) *
                         AbsDot(wo, wh) /
                         (AbsCosTheta(wi) * AbsCosTheta(wo) * Sqr(sqrtDenom))));

            Float dwh_dwi =
                /*Sqr(etap) * */ AbsDot(wi, wh) / Sqr(Dot(wo, wh) + etap * Dot(wi, wh));
            Float pdf = mfDistrib.PDF(wo, wh) * dwh_dwi * pt / (pr + pt);
            CHECK(!IsNaN(pdf));

            return BSDFSample(f, wi, pdf, BxDFFlags::GlossyTransmission, etap);
        }
    }
}